

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O1

Comment * soul::getComment(Comment *__return_storage_ptr__,Context *context)

{
  SourceCodeText *o;
  CodeLocation local_20;
  
  o = (context->location).sourceCode.object;
  if (o != (SourceCodeText *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  local_20.location.data = (context->location).location.data;
  local_20.sourceCode.object = o;
  SourceCodeUtilities::findPrecedingComment(__return_storage_ptr__,&local_20);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeUtilities::Comment getComment (const AST::Context& context)
{
    return SourceCodeUtilities::findPrecedingComment (context.location);
}